

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<WatchElem>_>::reserve(vec<vec<WatchElem>_> *this,uint size)

{
  uint uVar1;
  vec<WatchElem> *pvVar2;
  
  if (this->cap < size) {
    if (this->cap == 0) {
      uVar1 = 2;
      if (2 < size) {
        uVar1 = size;
      }
    }
    else {
      uVar1 = this->cap;
      do {
        uVar1 = uVar1 * 3 + 1 >> 1;
      } while (uVar1 < size);
    }
    this->cap = uVar1;
    pvVar2 = (vec<WatchElem> *)realloc(this->data,(ulong)uVar1 << 4);
    this->data = pvVar2;
  }
  return;
}

Assistant:

void reserve(unsigned int size) {
		if (size > cap) {
			if (cap == 0) {
				cap = (size > 2) ? size : 2;
			} else {
				do {
					cap = (cap * 3 + 1) >> 1;
				} while (cap < size);
			}
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
	}